

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

double * __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::choose_data
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,size_t desired_capacity)

{
  double *pdVar1;
  ulong __n;
  
  pdVar1 = this->m_dynamic_data;
  if (this->m_begin == pdVar1) {
    __n = this->m_dynamic_capacity;
    if (desired_capacity <= __n) {
      return pdVar1;
    }
    do {
      __n = __n * 3 + 1 >> 1;
    } while (__n < desired_capacity);
    this->m_dynamic_capacity = __n;
  }
  else {
    if (desired_capacity < 5) {
      return (double *)this->m_static_data;
    }
    if (desired_capacity <= this->m_dynamic_capacity) {
      return pdVar1;
    }
    if (pdVar1 != (double *)0x0) {
      operator_delete(pdVar1,this->m_dynamic_capacity << 3);
    }
    this->m_dynamic_capacity = desired_capacity;
    __n = desired_capacity;
  }
  pdVar1 = __gnu_cxx::new_allocator<double>::allocate((new_allocator<double> *)this,__n,(void *)0x0)
  ;
  this->m_dynamic_data = pdVar1;
  return pdVar1;
}

Assistant:

T* choose_data(size_t desired_capacity)
    {
        if (m_begin == m_dynamic_data)
        {
            // we're at the dyn buffer, so see if it needs resize or revert to static

            if (desired_capacity > m_dynamic_capacity)
            {
                while (m_dynamic_capacity < desired_capacity)
                {
                    // grow by roughly 1.5
                    m_dynamic_capacity *= 3;
                    ++m_dynamic_capacity;
                    m_dynamic_capacity /= 2;
                }

                m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                return m_dynamic_data;
            }
            else if (desired_capacity < RevertToStaticSize)
            {
                // we're reverting to the static buffer
                return static_begin_ptr();
            }
            else
            {
                // if the capacity and we don't revert to static, just do nothing
                return m_dynamic_data;
            }
        }
        else
        {
            assert(m_begin == static_begin_ptr()); // corrupt begin ptr?

            if (desired_capacity > StaticCapacity)
            {
                // we must move to dyn memory

                // see if we have enough
                if (desired_capacity > m_dynamic_capacity)
                {
                    // we need to allocate more
                    // we don't have anything to destroy, so we can also deallocate the buffer
                    if (m_dynamic_data)
                    {
                        atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
                    }

                    m_dynamic_capacity = desired_capacity;
                    m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                }

                return m_dynamic_data;
            }
            else
            {
                // we have enough capacity as it is
                return static_begin_ptr();
            }
        }
    }